

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters_sse2.c
# Opt level: O0

void DoVerticalFilter_SSE2(uint8_t *in,int width,int height,int stride,uint8_t *out)

{
  int in_ECX;
  int in_EDX;
  int in_ESI;
  undefined1 *in_RDI;
  undefined1 *in_R8;
  int row;
  int local_24;
  uint8_t *local_20;
  uint8_t *local_8;
  
  *in_R8 = *in_RDI;
  PredictLineLeft_SSE2(in_RDI + 1,in_R8 + 1,in_ESI + -1);
  local_8 = in_RDI + in_ECX;
  local_20 = in_R8 + in_ECX;
  for (local_24 = 1; local_24 < in_EDX; local_24 = local_24 + 1) {
    PredictLineTop_SSE2(local_8,local_8 + -(long)in_ECX,local_20,in_ESI);
    local_8 = local_8 + in_ECX;
    local_20 = local_20 + in_ECX;
  }
  return;
}

Assistant:

static WEBP_INLINE void DoVerticalFilter_SSE2(const uint8_t* WEBP_RESTRICT in,
                                              int width, int height, int stride,
                                              uint8_t* WEBP_RESTRICT out) {
  int row;
  DCHECK(in, out);

  // Very first top-left pixel is copied.
  out[0] = in[0];
  // Rest of top scan-line is left-predicted.
  PredictLineLeft_SSE2(in + 1, out + 1, width - 1);
  in += stride;
  out += stride;

  // Filter line-by-line.
  for (row = 1; row < height; ++row) {
    PredictLineTop_SSE2(in, in - stride, out, width);
    in += stride;
    out += stride;
  }
}